

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O3

UBool MBCSAddToUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  byte bVar1;
  ushort uVar2;
  UCMFile *pUVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint16_t *puVar8;
  ushort uVar9;
  ulong uVar10;
  FILE *__stream;
  uint uVar11;
  char cVar12;
  int iVar13;
  char cVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  char buffer [10];
  char local_52 [10];
  ulong local_48;
  MBCSData *local_40;
  FILE *local_38;
  
  __stream = _stderr;
  pUVar3 = mbcsData->ucm;
  if ((pUVar3->states).countStates == 0) {
    MBCSAddToUnicode();
    return '\0';
  }
  uVar10 = (ulong)(uint)c;
  iVar4 = 0;
  uVar16 = 0;
  if (length == 2) {
    uVar16 = (uint)((pUVar3->states).outputType == '\f');
  }
  uVar11 = *(uint *)((long)(pUVar3->states).stateTable[0] +
                    (ulong)*bytes * 4 + (ulong)(uVar16 << 10));
  uVar15 = uVar10;
  if (-1 < (int)uVar11) {
    if (length != 1) {
      uVar17 = 1;
      iVar4 = 0;
      do {
        uVar16 = uVar11 >> 0x18;
        iVar4 = (uVar11 & 0xffffff) + iVar4;
        uVar11 = *(uint *)((long)(pUVar3->states).stateTable[0] +
                          (ulong)bytes[uVar17] * 4 + (ulong)(uVar16 << 10));
        if ((int)uVar11 < 0) {
          iVar13 = (int)uVar17 + 1;
          goto LAB_001dcc6f;
        }
        uVar17 = uVar17 + 1;
      } while ((uint)length != uVar17);
    }
    if (length < 1) {
      pcVar6 = local_52;
    }
    else {
      uVar11 = length + 1;
      pcVar6 = local_52;
      do {
        bVar1 = *bytes;
        cVar12 = '0';
        cVar14 = '0';
        if (0x9f < bVar1) {
          cVar14 = 'W';
        }
        *pcVar6 = cVar14 + (bVar1 >> 4);
        if (9 < (bVar1 & 0xf)) {
          cVar12 = 'W';
        }
        pcVar6[1] = cVar12 + (bVar1 & 0xf);
        pcVar6 = pcVar6 + 2;
        bytes = bytes + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    *pcVar6 = '\0';
    pcVar6 = "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n";
    uVar10 = (ulong)uVar16;
    goto LAB_001dcf54;
  }
  iVar13 = 1;
  uVar17 = 0;
LAB_001dcc6f:
  if (length - iVar13 != 0 && iVar13 <= length) {
    uVar11 = length + 1;
    lVar7 = 0;
    do {
      bVar1 = bytes[lVar7];
      cVar12 = '0';
      cVar14 = '0';
      if (0x9f < bVar1) {
        cVar14 = 'W';
      }
      local_52[lVar7 * 2] = cVar14 + (bVar1 >> 4);
      if (9 < (bVar1 & 0xf)) {
        cVar12 = 'W';
      }
      local_52[lVar7 * 2 + 1] = cVar12 + (bVar1 & 0xf);
      lVar7 = lVar7 + 1;
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
    local_52[lVar7 * 2] = '\0';
    fprintf(_stderr,"error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
            (ulong)(uint)(length - iVar13),(ulong)uVar16,local_52,uVar10);
    return '\0';
  }
  uVar9 = (ushort)c;
  switch(uVar11 >> 0x14 & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
    if ((uVar11 & 0x80ffffff) != 0x8000fffe) {
      uVar5 = uVar11 & 0xfffff;
      if ((uVar11 >> 0x14 & 0xd) != 0) {
        uVar5 = uVar5 + 0x10000;
      }
      local_48 = uVar10;
      if (-1 < flag) {
        printBytes(local_52,bytes,length);
        pcVar6 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
        uVar15 = (ulong)uVar5;
        uVar10 = local_48;
        goto LAB_001dcf54;
      }
      if (VERBOSE != '\0') {
        local_38 = _stderr;
        local_40 = mbcsData;
        printBytes(local_52,bytes,length);
        fprintf(local_38,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",local_48,
                local_52,(ulong)uVar5);
        c = (UChar32)local_48;
        mbcsData = local_40;
      }
    }
    uVar5 = c - 0x10000;
    if (c < 0x10000) {
      uVar5 = c;
    }
    *(uint *)((long)(mbcsData->ucm->states).stateTable[0] +
             (ulong)bytes[uVar17] * 4 + (ulong)(uVar16 << 10)) =
         (uint)(flag == '\x03') << 0x15 | (uint)(0xffff < c) << 0x14 | uVar11 & 0xff000000 | uVar5;
    return '\x01';
  case 4:
    uVar11 = (uVar11 & 0xffff) + iVar4;
    uVar16 = (uint)mbcsData->unicodeCodeUnits[uVar11];
    if (mbcsData->unicodeCodeUnits[uVar11] == 0xfffe) {
      uVar5 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar11);
      if (-1 < (int)uVar5) {
        iVar4 = mbcsData->countToUFallbacks;
        uVar16 = mbcsData->toUFallbacks[uVar5].codePoint;
        mbcsData->toUFallbacks[uVar5] = mbcsData->toUFallbacks[(long)iVar4 + -1];
        mbcsData->countToUFallbacks = iVar4 + -1;
        if (uVar16 != 0xffffffff) goto LAB_001dce04;
      }
    }
    else {
LAB_001dce04:
      __stream = _stderr;
      if (-1 < flag) {
        uVar15 = (ulong)uVar16;
        printBytes(local_52,bytes,length);
        pcVar6 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
LAB_001dcf54:
        fprintf(__stream,pcVar6,uVar10,local_52,uVar15);
        return '\0';
      }
      if (VERBOSE != '\0') {
        local_48 = CONCAT44(local_48._4_4_,uVar16);
        local_40 = mbcsData;
        printBytes(local_52,bytes,length);
        fprintf(__stream,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",uVar10,
                local_52,local_48 & 0xffffffff);
        mbcsData = local_40;
      }
    }
    __stream = _stderr;
    if (c < 0x10000) {
      if (flag < '\x01') {
        mbcsData->unicodeCodeUnits[uVar11] = uVar9;
        return '\x01';
      }
      if (mbcsData->unicodeCodeUnits[uVar11] != 0xfffe) {
        return '\x01';
      }
      uVar16 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar11);
      if (-1 < (int)uVar16) {
        mbcsData->toUFallbacks[uVar16].codePoint = c;
        return '\x01';
      }
      iVar4 = mbcsData->countToUFallbacks;
      lVar7 = (long)iVar4;
      if (0x1fff < lVar7) {
        fprintf(_stderr,"error: too many toUnicode fallbacks, currently at: U+%x\n",uVar10);
        return '\0';
      }
      mbcsData->toUFallbacks[lVar7].offset = uVar11;
      mbcsData->toUFallbacks[lVar7].codePoint = c;
      mbcsData->countToUFallbacks = iVar4 + 1;
      return '\x01';
    }
    printBytes(local_52,bytes,length);
    pcVar6 = "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n";
    break;
  case 5:
    uVar11 = (uVar11 & 0xffff) + iVar4;
    puVar8 = mbcsData->unicodeCodeUnits;
    uVar2 = puVar8[uVar11];
    uVar16 = (uint)uVar2;
    if (uVar2 < 0xfffe) {
      if (0xd7ff < uVar2) {
        if (uVar2 < 0xe000) {
          uVar16 = (uVar2 & 0x3ff) * 0x400 + (puVar8[uVar11 + 1] & 0x3ff) + 0x10000;
        }
        else {
          uVar16 = (uint)puVar8[uVar11 + 1];
        }
      }
      if (-1 < flag) {
        printBytes(local_52,bytes,length);
        pcVar6 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
        uVar15 = (ulong)uVar16;
        goto LAB_001dcf54;
      }
      if (VERBOSE != '\0') {
        printBytes(local_52,bytes,length);
        fprintf(__stream,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",uVar10,
                local_52,(ulong)uVar16);
      }
    }
    else if ('\0' < flag) {
      if (0xffff < c) {
        puVar8[uVar11] = (short)((uint)c >> 10) + 0xdbc0;
        puVar8[uVar11 + 1] = uVar9 & 0x3ff | 0xdc00;
        return '\x01';
      }
      puVar8[uVar11] = 0xe001;
      goto LAB_001dcfe4;
    }
    if (c < 0xd800) {
      mbcsData->unicodeCodeUnits[uVar11] = uVar9;
      return '\x01';
    }
    if (0xffff < (uint)c) {
      puVar8 = mbcsData->unicodeCodeUnits;
      puVar8[uVar11] = (short)((uint)c >> 10) + 0xd7c0;
      puVar8[uVar11 + 1] = uVar9 & 0x3ff | 0xdc00;
      return '\x01';
    }
    puVar8 = mbcsData->unicodeCodeUnits;
    puVar8[uVar11] = 0xe000;
LAB_001dcfe4:
    puVar8[uVar11 + 1] = uVar9;
    return '\x01';
  case 6:
    printBytes(local_52,bytes,length);
    pcVar6 = "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n";
    break;
  case 7:
    printBytes(local_52,bytes,length);
    pcVar6 = "error: byte sequence ends in illegal state at U+%04x<->0x%s\n";
    break;
  case 8:
    printBytes(local_52,bytes,length);
    pcVar6 = "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n";
    break;
  default:
    printBytes(local_52,bytes,length);
    pcVar6 = 
    "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n";
    uVar10 = (ulong)uVar11;
    goto LAB_001dcf54;
  }
  fprintf(__stream,pcVar6,uVar10,local_52);
  return '\0';
}

Assistant:

static UBool
MBCSAddToUnicode(MBCSData *mbcsData,
                 const uint8_t *bytes, int32_t length,
                 UChar32 c,
                 int8_t flag) {
    char buffer[10];
    uint32_t offset=0;
    int32_t i=0, entry, old;
    uint8_t state=0;

    if(mbcsData->ucm->states.countStates==0) {
        fprintf(stderr, "error: there is no state information!\n");
        return FALSE;
    }

    /* for SI/SO (like EBCDIC-stateful), double-byte sequences start in state 1 */
    if(length==2 && mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO) {
        state=1;
    }

    /*
     * Walk down the state table like in conversion,
     * much like getNextUChar().
     * We assume that c<=0x10ffff.
     */
    for(i=0;;) {
        entry=mbcsData->ucm->states.stateTable[state][bytes[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(i==length) {
                fprintf(stderr, "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n",
                    (short)state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
        } else {
            if(i<length) {
                fprintf(stderr, "error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
                    (int)(length-i), state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            switch(MBCS_ENTRY_FINAL_ACTION(entry)) {
            case MBCS_STATE_ILLEGAL:
                fprintf(stderr, "error: byte sequence ends in illegal state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_CHANGE_ONLY:
                fprintf(stderr, "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_UNASSIGNED:
                fprintf(stderr, "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_FALLBACK_DIRECT_16:
            case MBCS_STATE_VALID_DIRECT_16:
            case MBCS_STATE_FALLBACK_DIRECT_20:
            case MBCS_STATE_VALID_DIRECT_20:
                if(MBCS_ENTRY_SET_STATE(entry, 0)!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, 0xfffe)) {
                    /* the "direct" action's value is not "valid-direct-16-unassigned" any more */
                    if(MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_DIRECT_16 || MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_FALLBACK_DIRECT_16) {
                        old=MBCS_ENTRY_FINAL_VALUE(entry);
                    } else {
                        old=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                    /*
                     * Continue after the above warning
                     * if the precision of the mapping is unspecified.
                     */
                }
                /* reassign the correct action code */
                entry=MBCS_ENTRY_FINAL_SET_ACTION(entry, (MBCS_STATE_VALID_DIRECT_16+(flag==3 ? 2 : 0)+(c>=0x10000 ? 1 : 0)));

                /* put the code point into bits 22..7 for BMP, c-0x10000 into 26..7 for others */
                if(c<=0xffff) {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c);
                } else {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c-0x10000);
                }
                mbcsData->ucm->states.stateTable[state][bytes[i-1]]=entry;
                break;
            case MBCS_STATE_VALID_16:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to one 16-bit code unit */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                if((old=mbcsData->unicodeCodeUnits[offset])!=0xfffe || (old=removeFallback(mbcsData, offset))!=-1) {
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                }
                if(c>=0x10000) {
                    fprintf(stderr, "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n",
                        (int)c, printBytes(buffer, bytes, length));
                    return FALSE;
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(mbcsData->unicodeCodeUnits[offset]==0xfffe) {
                        return setFallback(mbcsData, offset, c);
                    }
                } else {
                    mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                }
                break;
            case MBCS_STATE_VALID_16_PAIR:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to two 16-bit code units */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                old=mbcsData->unicodeCodeUnits[offset];
                if(old<0xfffe) {
                    int32_t real;
                    if(old<0xd800) {
                        real=old;
                    } else if(old<=0xdfff) {
                        real=0x10000+((old&0x3ff)<<10)+((mbcsData->unicodeCodeUnits[offset+1])&0x3ff);
                    } else /* old<=0xe001 */ {
                        real=mbcsData->unicodeCodeUnits[offset+1];
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                    }
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(old<=0xdbff || old==0xe000) {
                        /* do nothing */
                    } else if(c<=0xffff) {
                        /* set a BMP fallback code point as a pair with 0xe001 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe001;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a fallback surrogate pair with two second surrogates */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xdbc0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                } else {
                    if(c<0xd800) {
                        /* set a BMP code point */
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else if(c<=0xffff) {
                        /* set a BMP code point above 0xd800 as a pair with 0xe000 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe000;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a surrogate pair */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xd7c0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                }
                break;
            default:
                /* reserved, must never occur */
                fprintf(stderr, "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n",
                    (int)entry, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }

            return TRUE;
        }
    }
}